

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<long,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint uVar1;
  _func_int *p_Var2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  pointer pSVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  _func_int **pp_Var12;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pSVar7 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar7 + 3));
  p_Var2 = pSVar7[3]._vptr_SegmentScanState[2];
  iVar3 = segment->offset;
  uVar1 = *(uint *)&pSVar7[6]._vptr_SegmentScanState;
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar6 = _DAT_012b0ff0;
  auVar16 = _DAT_012b0fe0;
  uVar15 = scan_count + result_offset;
  if (result_offset < uVar15) {
    pp_Var12 = pSVar7[4]._vptr_SegmentScanState;
    pp_Var13 = pSVar7[5]._vptr_SegmentScanState;
    do {
      pp_Var14 = (_func_int **)(ulong)*(ushort *)(p_Var2 + (long)pp_Var12 * 2 + uVar1 + iVar3);
      uVar9 = (long)pp_Var14 - (long)pp_Var13;
      uVar8 = uVar15 - result_offset;
      uVar5 = *(undefined8 *)(p_Var2 + (long)pp_Var12 * 8 + iVar3 + 8);
      if (uVar8 < uVar9) {
        if (uVar15 != result_offset) {
          lVar10 = uVar8 + (uVar8 == 0);
          lVar11 = lVar10 + -1;
          auVar19._8_4_ = (int)lVar11;
          auVar19._0_8_ = lVar11;
          auVar19._12_4_ = (int)((ulong)lVar11 >> 0x20);
          uVar15 = 0;
          auVar19 = auVar19 ^ auVar6;
          auVar16 = _DAT_012b0fe0;
          do {
            auVar18 = auVar16 ^ auVar6;
            if ((bool)(~(auVar18._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar18._0_4_ ||
                        auVar19._4_4_ < auVar18._4_4_) & 1)) {
              *(undefined8 *)(pdVar4 + uVar15 * 8 + result_offset * 8) = uVar5;
            }
            if ((auVar18._12_4_ != auVar19._12_4_ || auVar18._8_4_ <= auVar19._8_4_) &&
                auVar18._12_4_ <= auVar19._12_4_) {
              *(undefined8 *)(pdVar4 + uVar15 * 8 + result_offset * 8 + 8) = uVar5;
            }
            uVar15 = uVar15 + 2;
            lVar11 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar11 + 2;
          } while ((lVar10 + 1U & 0xfffffffffffffffe) != uVar15);
          pp_Var13 = pSVar7[5]._vptr_SegmentScanState;
        }
        pSVar7[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var13 + uVar8);
        return;
      }
      if (pp_Var14 != pp_Var13) {
        lVar10 = uVar9 - 1;
        auVar17._8_4_ = (int)lVar10;
        auVar17._0_8_ = lVar10;
        auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
        auVar17 = auVar17 ^ auVar6;
        uVar8 = 0;
        auVar18 = auVar16;
        do {
          auVar19 = auVar18 ^ auVar6;
          if ((bool)(~(auVar17._4_4_ < auVar19._4_4_ ||
                      auVar17._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar17._4_4_) & 1)) {
            *(undefined8 *)(pdVar4 + uVar8 * 8 + result_offset * 8) = uVar5;
          }
          if (auVar19._12_4_ <= auVar17._12_4_ &&
              (auVar19._8_4_ <= auVar17._8_4_ || auVar19._12_4_ != auVar17._12_4_)) {
            *(undefined8 *)(pdVar4 + uVar8 * 8 + result_offset * 8 + 8) = uVar5;
          }
          uVar8 = uVar8 + 2;
          lVar10 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar10 + 2;
        } while ((uVar9 + 1 & 0xfffffffffffffffe) != uVar8);
        pp_Var12 = pSVar7[4]._vptr_SegmentScanState;
      }
      result_offset = result_offset + uVar9;
      pp_Var12 = (_func_int **)((long)pp_Var12 + 1);
      pSVar7[4]._vptr_SegmentScanState = pp_Var12;
      pSVar7[5]._vptr_SegmentScanState = (_func_int **)0x0;
      pp_Var13 = (_func_int **)0x0;
    } while (result_offset < uVar15);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}